

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,WriteToEndpoint *w)

{
  Allocator *allocator;
  bool bVar1;
  uint uVar2;
  OutputEndpointRef *pOVar3;
  EndpointDeclaration *pEVar4;
  Expression *pEVar5;
  Type local_60;
  pool_ref<soul::AST::Expression> local_38;
  pool_ptr<soul::AST::OutputEndpointRef> local_30;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint;
  WriteToEndpoint *topLevelWrite;
  WriteToEndpoint *w_local;
  OperatorResolver *this_local;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,w);
  uVar2 = (*(w->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
  if ((uVar2 & 1) == 0) {
    (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
         (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
  }
  else {
    outputEndpoint.object = (OutputEndpointRef *)ASTUtilities::getTopLevelWriteToEndpoint(w);
    local_38.object = (((WriteToEndpoint *)outputEndpoint.object)->target).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_30,&local_38);
    pool_ref<soul::AST::Expression>::~pool_ref(&local_38);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
    if (bVar1) {
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_30);
      pEVar4 = pool_ref::operator_cast_to_EndpointDeclaration_((pool_ref *)&pOVar3->output);
      bVar1 = ASTUtilities::isConsoleEndpoint(pEVar4);
      if (bVar1) {
        allocator = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_30);
        pEVar4 = pool_ref::operator_cast_to_EndpointDeclaration_((pool_ref *)&pOVar3->output);
        pEVar5 = pool_ref<soul::AST::Expression>::operator->(&w->value);
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_60);
        ASTUtilities::ensureEventEndpointSupportsType(allocator,pEVar4,&local_60);
        Type::~Type(&local_60);
      }
    }
    pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr(&local_30);
  }
  return &w->super_Expression;
}

Assistant:

AST::Expression& visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            if (! w.isResolved())
            {
                ++numFails;
                return w;
            }

            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
                if (ASTUtilities::isConsoleEndpoint (outputEndpoint->output))
                    ASTUtilities::ensureEventEndpointSupportsType (allocator, outputEndpoint->output, w.value->getResultType());

            return w;
        }